

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# runner.c
# Opt level: O1

int run_tests(int benchmark_output)

{
  _func_int *p_Var1;
  task_entry_t *ptVar2;
  int iVar3;
  _func_int **pp_Var4;
  ulong uVar5;
  uint uVar6;
  int iVar7;
  task_entry_t *ptVar8;
  
  ptVar8 = TASKS;
  uVar5 = 0;
  uVar6 = 0;
  iVar7 = 0;
  if (TASKS[0].main != (_func_int *)0x0) {
    pp_Var4 = &TASKS[1].main;
    iVar7 = 0;
    uVar6 = 0;
    do {
      uVar6 = uVar6 + ((int)pp_Var4[-4] == 0);
      iVar7 = iVar7 + 1;
      p_Var1 = *pp_Var4;
      pp_Var4 = pp_Var4 + 5;
    } while (p_Var1 != (_func_int *)0x0);
  }
  if (iVar7 != 0) {
    iVar3 = strcmp(TASKS[0].task_name,"platform_output");
    uVar5 = (ulong)(iVar3 == 0);
  }
  qsort(TASKS + uVar5,(long)(iVar7 - (int)uVar5),0x28,compare_task);
  iVar7 = 0;
  fprintf(_stderr,"1..%d\n",(ulong)uVar6);
  fflush(_stderr);
  if (TASKS[0].main != (_func_int *)0x0) {
    iVar7 = 0;
    iVar3 = 1;
    do {
      if (ptVar8->is_helper == 0) {
        uVar6 = run_test(ptVar8->task_name,benchmark_output,iVar3);
        iVar7 = (iVar7 + 1) - (uint)(uVar6 < 2);
        iVar3 = iVar3 + 1;
      }
      ptVar2 = ptVar8 + 1;
      ptVar8 = ptVar8 + 1;
    } while (ptVar2->main != (_func_int *)0x0);
  }
  return iVar7;
}

Assistant:

int run_tests(int benchmark_output) {
  int actual;
  int total;
  int passed;
  int failed;
  int skipped;
  int current;
  int test_result;
  int skip;
  task_entry_t* task;

  /* Count the number of tests. */
  actual = 0;
  total = 0;
  for (task = TASKS; task->main; task++, actual++) {
    if (!task->is_helper) {
      total++;
    }
  }

  /* Keep platform_output first. */
  skip = (actual > 0 && 0 == strcmp(TASKS[0].task_name, "platform_output"));
  qsort(TASKS + skip, actual - skip, sizeof(TASKS[0]), compare_task);

  fprintf(stderr, "1..%d\n", total);
  fflush(stderr);

  /* Run all tests. */
  passed = 0;
  failed = 0;
  skipped = 0;
  current = 1;
  for (task = TASKS; task->main; task++) {
    if (task->is_helper) {
      continue;
    }

    test_result = run_test(task->task_name, benchmark_output, current);
    switch (test_result) {
    case TEST_OK: passed++; break;
    case TEST_SKIP: skipped++; break;
    default: failed++;
    }
    current++;
  }

  return failed;
}